

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

void save_load_tree(log_multi *b,io_buf *model_file,bool read,bool text)

{
  node_pred *pnVar1;
  ostream *poVar2;
  double *data;
  uint32_t *data_00;
  size_t k_1;
  ulong uVar3;
  uint32_t j;
  uint uVar4;
  node *pnVar5;
  long lVar6;
  uint32_t temp_1;
  uint32_t temp;
  ulong local_220;
  node *local_218;
  stringstream msg;
  ostream local_200;
  node local_88;
  
  if ((model_file->files)._end != (model_file->files)._begin) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar2 = std::operator<<(&local_200,"k = ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    bin_text_read_write_fixed(model_file,(char *)&b->max_predictors,4,"",read,&msg,text);
    poVar2 = std::operator<<(&local_200,"nodes = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," ");
    temp = (uint32_t)(((long)(b->nodes)._end - (long)(b->nodes)._begin) / 0x58);
    bin_text_read_write_fixed(model_file,(char *)&temp,4,"",read,&msg,text);
    if (read) {
      for (uVar4 = 1; uVar4 < temp; uVar4 = uVar4 + 1) {
        init_node();
        v_array<node>::push_back(&b->nodes,&local_88);
      }
    }
    poVar2 = std::operator<<(&local_200,"max predictors = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," ");
    bin_text_read_write_fixed(model_file,(char *)&b->max_predictors,8,"",read,&msg,text);
    poVar2 = std::operator<<(&local_200,"predictors_used = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," ");
    bin_text_read_write_fixed(model_file,(char *)&b->predictors_used,8,"",read,&msg,text);
    poVar2 = std::operator<<(&local_200,"progress = ");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2," ");
    bin_text_read_write_fixed(model_file,&b->progress,1,"",read,&msg,text);
    poVar2 = std::operator<<(&local_200,"swap_resist = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
    bin_text_read_write_fixed(model_file,(char *)&b->swap_resist,4,"",read,&msg,text);
    local_220 = 0;
    while( true ) {
      pnVar5 = (b->nodes)._begin;
      if ((ulong)(((long)(b->nodes)._end - (long)pnVar5) / 0x58) <= local_220) break;
      poVar2 = std::operator<<(&local_200," parent = ");
      pnVar5 = pnVar5 + local_220;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      bin_text_read_write_fixed(model_file,(char *)pnVar5,4,"",read,&msg,text);
      temp_1 = (uint32_t)(((long)(pnVar5->preds)._end - (long)(pnVar5->preds)._begin) / 0x18);
      poVar2 = std::operator<<(&local_200," preds = ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      bin_text_read_write_fixed(model_file,(char *)&temp_1,4,"",read,&msg,text);
      if (read) {
        for (uVar4 = 0; uVar4 < temp_1; uVar4 = uVar4 + 1) {
          local_88.preds._end = (node_pred *)0x1;
          local_88.parent = 0;
          local_88._4_4_ = 0;
          local_88.preds._begin = (node_pred *)0x0;
          v_array<node_pred>::push_back(&pnVar5->preds,(node_pred *)&local_88);
        }
      }
      poVar2 = std::operator<<(&local_200," min_count = ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      bin_text_read_write_fixed(model_file,(char *)&pnVar5->min_count,4,"",read,&msg,text);
      poVar2 = std::operator<<(&local_200," internal = ");
      std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      bin_text_read_write_fixed(model_file,&pnVar5->internal,1,"",read,&msg,text);
      if (pnVar5->internal == true) {
        poVar2 = std::operator<<(&local_200," base_predictor = ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        bin_text_read_write_fixed(model_file,(char *)&pnVar5->base_predictor,4,"",read,&msg,text);
        poVar2 = std::operator<<(&local_200," left = ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        bin_text_read_write_fixed(model_file,(char *)&pnVar5->left,4,"",read,&msg,text);
        poVar2 = std::operator<<(&local_200," right = ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        bin_text_read_write_fixed(model_file,(char *)&pnVar5->right,4,"",read,&msg,text);
        poVar2 = std::operator<<(&local_200," norm_Eh = ");
        std::ostream::operator<<(poVar2,pnVar5->norm_Eh);
        bin_text_read_write_fixed(model_file,(char *)&pnVar5->norm_Eh,4,"",read,&msg,text);
        std::operator<<(&local_200," Eh = ");
        std::ostream::_M_insert<double>(pnVar5->Eh);
        bin_text_read_write_fixed(model_file,(char *)&pnVar5->Eh,8,"",read,&msg,text);
        poVar2 = std::operator<<(&local_200," n = ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2,"\n");
        data_00 = &pnVar5->n;
      }
      else {
        poVar2 = std::operator<<(&local_200," max_count = ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        bin_text_read_write_fixed(model_file,(char *)&pnVar5->max_count,4,"",read,&msg,text);
        poVar2 = std::operator<<(&local_200," max_count_label = ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2,"\n");
        data_00 = &pnVar5->max_count_label;
      }
      bin_text_read_write_fixed(model_file,(char *)data_00,4,"",read,&msg,text);
      lVar6 = 0xc;
      uVar3 = 0;
      local_218 = pnVar5;
      while( true ) {
        pnVar1 = (local_218->preds)._begin;
        if ((ulong)(((long)(local_218->preds)._end - (long)pnVar1) / 0x18) <= uVar3) break;
        std::operator<<(&local_200,"  Ehk = ");
        data = (double *)((long)pnVar1 + lVar6 + -0xc);
        std::ostream::_M_insert<double>(*data);
        bin_text_read_write_fixed(model_file,(char *)data,8,"",read,&msg,text);
        poVar2 = std::operator<<(&local_200," norm_Ehk = ");
        std::ostream::operator<<(poVar2,*(float *)((long)pnVar1 + lVar6 + -4));
        bin_text_read_write_fixed
                  (model_file,(char *)((long)pnVar1 + lVar6 + -4),4,"",read,&msg,text);
        poVar2 = std::operator<<(&local_200," nk = ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        bin_text_read_write_fixed
                  (model_file,(char *)((long)&pnVar1->Ehk + lVar6),4,"",read,&msg,text);
        poVar2 = std::operator<<(&local_200," label = ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        bin_text_read_write_fixed
                  (model_file,(char *)((long)&pnVar1->Ehk + lVar6 + 4),4,"",read,&msg,text);
        poVar2 = std::operator<<(&local_200," label_count = ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2,"\n");
        bin_text_read_write_fixed
                  (model_file,(char *)((long)&pnVar1->norm_Ehk + lVar6),4,"",read,&msg,text);
        uVar3 = uVar3 + 1;
        lVar6 = lVar6 + 0x18;
      }
      local_220 = local_220 + 1;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  return;
}

Assistant:

void save_load_tree(log_multi& b, io_buf& model_file, bool read, bool text)
{
  if (model_file.files.size() > 0)
  {
    stringstream msg;
    msg << "k = " << b.k;
    bin_text_read_write_fixed(model_file, (char*)&b.max_predictors, sizeof(b.k), "", read, msg, text);

    msg << "nodes = " << b.nodes.size() << " ";
    uint32_t temp = (uint32_t)b.nodes.size();
    bin_text_read_write_fixed(model_file, (char*)&temp, sizeof(temp), "", read, msg, text);
    if (read)
      for (uint32_t j = 1; j < temp; j++) b.nodes.push_back(init_node());

    msg << "max predictors = " << b.max_predictors << " ";
    bin_text_read_write_fixed(model_file, (char*)&b.max_predictors, sizeof(b.max_predictors), "", read, msg, text);

    msg << "predictors_used = " << b.predictors_used << " ";
    bin_text_read_write_fixed(model_file, (char*)&b.predictors_used, sizeof(b.predictors_used), "", read, msg, text);

    msg << "progress = " << b.progress << " ";
    bin_text_read_write_fixed(model_file, (char*)&b.progress, sizeof(b.progress), "", read, msg, text);

    msg << "swap_resist = " << b.swap_resist << "\n";
    bin_text_read_write_fixed(model_file, (char*)&b.swap_resist, sizeof(b.swap_resist), "", read, msg, text);

    for (size_t j = 0; j < b.nodes.size(); j++)
    {
      // Need to read or write nodes.
      node& n = b.nodes[j];

      msg << " parent = " << n.parent;
      bin_text_read_write_fixed(model_file, (char*)&n.parent, sizeof(n.parent), "", read, msg, text);

      uint32_t temp = (uint32_t)n.preds.size();

      msg << " preds = " << temp;
      bin_text_read_write_fixed(model_file, (char*)&temp, sizeof(temp), "", read, msg, text);
      if (read)
        for (uint32_t k = 0; k < temp; k++) n.preds.push_back(node_pred(1));

      msg << " min_count = " << n.min_count;
      bin_text_read_write_fixed(model_file, (char*)&n.min_count, sizeof(n.min_count), "", read, msg, text);

      msg << " internal = " << n.internal;
      bin_text_read_write_fixed(model_file, (char*)&n.internal, sizeof(n.internal), "", read, msg, text);

      if (n.internal)
      {
        msg << " base_predictor = " << n.base_predictor;
        bin_text_read_write_fixed(model_file, (char*)&n.base_predictor, sizeof(n.base_predictor), "", read, msg, text);

        msg << " left = " << n.left;
        bin_text_read_write_fixed(model_file, (char*)&n.left, sizeof(n.left), "", read, msg, text);

        msg << " right = " << n.right;
        bin_text_read_write_fixed(model_file, (char*)&n.right, sizeof(n.right), "", read, msg, text);

        msg << " norm_Eh = " << n.norm_Eh;
        bin_text_read_write_fixed(model_file, (char*)&n.norm_Eh, sizeof(n.norm_Eh), "", read, msg, text);

        msg << " Eh = " << n.Eh;
        bin_text_read_write_fixed(model_file, (char*)&n.Eh, sizeof(n.Eh), "", read, msg, text);

        msg << " n = " << n.n << "\n";
        bin_text_read_write_fixed(model_file, (char*)&n.n, sizeof(n.n), "", read, msg, text);
      }
      else
      {
        msg << " max_count = " << n.max_count;
        bin_text_read_write_fixed(model_file, (char*)&n.max_count, sizeof(n.max_count), "", read, msg, text);
        msg << " max_count_label = " << n.max_count_label << "\n";
        bin_text_read_write_fixed(
            model_file, (char*)&n.max_count_label, sizeof(n.max_count_label), "", read, msg, text);
      }

      for (size_t k = 0; k < n.preds.size(); k++)
      {
        node_pred& p = n.preds[k];

        msg << "  Ehk = " << p.Ehk;
        bin_text_read_write_fixed(model_file, (char*)&p.Ehk, sizeof(p.Ehk), "", read, msg, text);

        msg << " norm_Ehk = " << p.norm_Ehk;
        bin_text_read_write_fixed(model_file, (char*)&p.norm_Ehk, sizeof(p.norm_Ehk), "", read, msg, text);

        msg << " nk = " << p.nk;
        bin_text_read_write_fixed(model_file, (char*)&p.nk, sizeof(p.nk), "", read, msg, text);

        msg << " label = " << p.label;
        bin_text_read_write_fixed(model_file, (char*)&p.label, sizeof(p.label), "", read, msg, text);

        msg << " label_count = " << p.label_count << "\n";
        bin_text_read_write_fixed(model_file, (char*)&p.label_count, sizeof(p.label_count), "", read, msg, text);
      }
    }
  }
}